

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmEnterFrame(jx9_vm *pVm,void *pUserData,VmFrame **ppFrame)

{
  VmFrame *pVVar1;
  VmFrame *pFrame;
  VmFrame **ppFrame_local;
  void *pUserData_local;
  jx9_vm *pVm_local;
  
  pVVar1 = VmNewFrame(pVm,pUserData);
  if (pVVar1 == (VmFrame *)0x0) {
    pVm_local._4_4_ = -1;
  }
  else {
    pVVar1->pParent = pVm->pFrame;
    pVm->pFrame = pVVar1;
    if (ppFrame != (VmFrame **)0x0) {
      *ppFrame = pVVar1;
    }
    pVm_local._4_4_ = 0;
  }
  return pVm_local._4_4_;
}

Assistant:

static sxi32 VmEnterFrame(
	jx9_vm *pVm,               /* Target VM */
	void *pUserData,           /* Upper-layer private data */
	VmFrame **ppFrame          /* OUT: Top most active frame */
	)
{
	VmFrame *pFrame;
	/* Allocate a new frame */
	pFrame = VmNewFrame(&(*pVm), pUserData);
	if( pFrame == 0 ){
		return SXERR_MEM;
	}
	/* Link to the list of active VM frame */
	pFrame->pParent = pVm->pFrame;
	pVm->pFrame = pFrame;
	if( ppFrame ){
		/* Write a pointer to the new VM frame */
		*ppFrame = pFrame;
	}
	return SXRET_OK;
}